

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParsePayload(AsciiParser *this,Payload *out,bool *triple_deliminated)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_389;
  string local_388;
  Path local_368;
  undefined1 local_298 [8];
  string path;
  undefined1 local_270 [3];
  char c;
  ostringstream local_250 [8];
  ostringstream ss_e;
  undefined1 local_d8 [8];
  AssetPath ap;
  string local_90;
  AssetPath local_70;
  char local_29;
  bool *pbStack_28;
  char nc;
  bool *triple_deliminated_local;
  Payload *out_local;
  AsciiParser *this_local;
  
  pbStack_28 = triple_deliminated;
  triple_deliminated_local = (bool *)out;
  out_local = (Payload *)this;
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    bVar1 = LookChar1(this,&local_29);
    if (bVar1) {
      if (local_29 == '<') {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_90,"",
                   (allocator *)(ap.resolved_path_.field_2._M_local_buf + 0xf));
        tinyusdz::value::AssetPath::AssetPath(&local_70,&local_90);
        tinyusdz::value::AssetPath::operator=((AssetPath *)triple_deliminated_local,&local_70);
        tinyusdz::value::AssetPath::~AssetPath(&local_70);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(ap.resolved_path_.field_2._M_local_buf + 0xf));
      }
      else {
        tinyusdz::value::AssetPath::AssetPath((AssetPath *)local_d8);
        bVar1 = ParseAssetIdentifier(this,(AssetPath *)local_d8,pbStack_28);
        if (bVar1) {
          tinyusdz::value::AssetPath::operator=
                    ((AssetPath *)triple_deliminated_local,(AssetPath *)local_d8);
          path.field_2._12_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_250);
          poVar2 = ::std::operator<<((ostream *)local_250,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[ASCII]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ParsePayload");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa26);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_250,"Failed to parse asset path identifier.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)local_270);
          ::std::__cxx11::string::~string((string *)local_270);
          this_local._7_1_ = 0;
          path.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_250);
        }
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_d8);
        if (path.field_2._12_4_ != 0) goto LAB_0055e440;
      }
      bVar1 = SkipWhitespace(this);
      if (bVar1) {
        bVar1 = Char1(this,path.field_2._M_local_buf + 0xb);
        if (bVar1) {
          if (path.field_2._M_local_buf[0xb] == '<') {
            bVar1 = Rewind(this,1);
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_0055e440;
            }
            ::std::__cxx11::string::string((string *)local_298);
            bVar1 = ReadPathIdentifier(this,(string *)local_298);
            if (bVar1) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_388,"",&local_389);
              Path::Path(&local_368,(string *)local_298,&local_388);
              Path::operator=((Path *)(triple_deliminated_local + 0x40),&local_368);
              Path::~Path(&local_368);
              ::std::__cxx11::string::~string((string *)&local_388);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
            }
            else {
              this_local._7_1_ = 0;
            }
            path.field_2._13_3_ = 0;
            path.field_2._M_local_buf[0xc] = !bVar1;
            ::std::__cxx11::string::~string((string *)local_298);
            if (path.field_2._12_4_ != 0) goto LAB_0055e440;
          }
          else {
            bVar1 = Rewind(this,1);
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_0055e440;
            }
          }
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0055e440:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParsePayload(Payload *out, bool *triple_deliminated) {
  // Reference, but no customData.

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // Parse AssetIdentifier
  {
    char nc;
    if (!LookChar1(&nc)) {
      return false;
    }

    if (nc == '<') {
      // No Asset Identifier.
      out->asset_path = value::AssetPath("");
    } else {
      value::AssetPath ap;
      if (!ParseAssetIdentifier(&ap, triple_deliminated)) {
        PUSH_ERROR_AND_RETURN_TAG(kAscii,
                                  "Failed to parse asset path identifier.");
      }
      out->asset_path = ap;
    }
  }

  // Parse optional prim_path
  if (!SkipWhitespace()) {
    return false;
  }

  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '<') {
      if (!Rewind(1)) {
        return false;
      }

      std::string path;
      if (!ReadPathIdentifier(&path)) {
        return false;
      }

      out->prim_path = Path(path, "");
    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  // TODO: LayerOffset

  return true;
}